

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

ly_bool warn_is_specific_type(lysc_type *type,LY_DATA_TYPE base)

{
  LY_DATA_TYPE LVar1;
  lyplg_type_sort_clb p_Var2;
  ly_bool lVar3;
  ulong uVar4;
  ulong uVar5;
  
  while( true ) {
    LVar1 = *(LY_DATA_TYPE *)&((lyplg_type *)type)->compare;
    if (LVar1 == base) {
      return '\x01';
    }
    if (LVar1 != LY_TYPE_LEAFREF) break;
    type = (lysc_type *)((lysc_type *)&((lyplg_type *)type)->duplicate)->name;
  }
  if (LVar1 == LY_TYPE_UNION) {
    p_Var2 = ((lyplg_type *)type)->sort;
    uVar5 = 0;
    while( true ) {
      if (p_Var2 == (lyplg_type_sort_clb)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)(p_Var2 + -8);
      }
      if (uVar4 <= uVar5) break;
      lVar3 = warn_is_specific_type(*(lysc_type **)(p_Var2 + uVar5 * 8),base);
      uVar5 = uVar5 + 1;
      if (lVar3 != '\0') {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static ly_bool
warn_is_specific_type(struct lysc_type *type, LY_DATA_TYPE base)
{
    struct lysc_type_union *uni;
    ly_bool ret;
    LY_ARRAY_COUNT_TYPE u;

    if (type->basetype == base) {
        return 1;
    } else if (type->basetype == LY_TYPE_UNION) {
        uni = (struct lysc_type_union *)type;
        LY_ARRAY_FOR(uni->types, u) {
            ret = warn_is_specific_type(uni->types[u], base);
            if (ret) {
                /* found a suitable type */
                return ret;
            }
        }
        /* did not find any suitable type */
        return 0;
    } else if (type->basetype == LY_TYPE_LEAFREF) {
        return warn_is_specific_type(((struct lysc_type_leafref *)type)->realtype, base);
    }

    return 0;
}